

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O0

void adj_abon(obj *otmp,schar delta)

{
  bool bVar1;
  boolean isnormal;
  schar delta_local;
  obj *otmp_local;
  
  if (otmp != (obj *)0x0) {
    bVar1 = false;
    if (uarmg == otmp) {
      bVar1 = otmp->otyp == 0x92;
    }
    if ((bVar1) || ((otmp->oprops & 0x100U) != 0)) {
      if (delta != '\0') {
        if (bVar1) {
          discover_object((int)otmp->otyp,'\x01','\x01');
        }
        if ((otmp->oprops & 0x100U) != 0) {
          otmp->oprops_known = otmp->oprops_known | 0x100;
        }
        u.abon.a[3] = u.abon.a[3] + delta;
      }
      iflags.botl = '\x01';
    }
    bVar1 = false;
    if (uarmh == otmp) {
      bVar1 = otmp->otyp == 0x51;
    }
    if ((bVar1) || ((otmp->oprops & 0x200U) != 0)) {
      if (delta != '\0') {
        if (bVar1) {
          discover_object((int)otmp->otyp,'\x01','\x01');
        }
        if ((otmp->oprops & 0x200U) != 0) {
          otmp->oprops_known = otmp->oprops_known | 0x200;
        }
        u.abon.a[1] = u.abon.a[1] + delta;
        u.abon.a[2] = u.abon.a[2] + delta;
      }
      iflags.botl = '\x01';
    }
  }
  return;
}

Assistant:

void adj_abon(struct obj *otmp, schar delta)
{
	boolean isnormal;

	if (!otmp) return;

	isnormal = (uarmg == otmp && otmp->otyp == GAUNTLETS_OF_DEXTERITY);
	if (isnormal || (otmp->oprops & ITEM_DEXTERITY)) {
		if (delta) {
			if (isnormal)
				makeknown(otmp->otyp);
			if (otmp->oprops & ITEM_DEXTERITY)
				otmp->oprops_known |= ITEM_DEXTERITY;
			ABON(A_DEX) += (delta);
		}
		iflags.botl = 1;
	}

	isnormal = (uarmh == otmp && otmp->otyp == HELM_OF_BRILLIANCE);
	if (isnormal || (otmp->oprops & ITEM_BRILLIANCE)) {
		if (delta) {
			if (isnormal)
				makeknown(otmp->otyp);
			if (otmp->oprops & ITEM_BRILLIANCE)
				otmp->oprops_known |= ITEM_BRILLIANCE;
			ABON(A_INT) += (delta);
			ABON(A_WIS) += (delta);
		}
		iflags.botl = 1;
	}
}